

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::resetPoolNoFlagsTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  VkCommandPoolCreateInfo cmdPoolParams;
  allocator<char> local_79;
  string local_78;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_58;
  VkCommandPoolCreateInfo local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_38.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_78,vk,device,&local_38,
             (VkAllocationCallbacks *)0x0);
  local_58.m_data.deleter.m_device = (VkDevice)local_78.field_2._M_allocated_capacity;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_78.field_2._8_8_;
  local_58.m_data.object.m_internal = (deUint64)local_78._M_dataplus._M_p;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)local_78._M_string_length;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_78);
  result = (*vk->_vptr_DeviceInterface[0x46])(vk,device,local_58.m_data.object.m_internal,0);
  ::vk::checkResult(result,"vk.resetCommandPool(vkDevice, *cmdPool, 0u)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x24c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Command Pool allocated correctly.",&local_79);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus resetPoolNoFlagsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL));

	VK_CHECK(vk.resetCommandPool(vkDevice, *cmdPool, 0u));

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}